

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,bool value,string *url)

{
  char *__s;
  long lVar1;
  ostream *poVar2;
  TAG *this_00;
  allocator<char> local_c81;
  string local_c80;
  string local_c60;
  undefined1 local_c40 [8];
  A a;
  stringstream href;
  ostream local_a78 [376];
  undefined1 local_900 [8];
  CENTER center;
  TD td_2;
  string local_588;
  undefined1 local_568 [8];
  TD td_1;
  TD td;
  undefined1 local_1e8 [8];
  TR tr;
  string *url_local;
  bool value_local;
  string *name_local;
  stringstream *s_local;
  HttpConnection *this_local;
  
  tr.super_TAG.m_stream = (ostream *)url;
  HTML::TR::TR((TR *)local_1e8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_1e8);
  HTML::TD::TD((TD *)&td_1.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&td_1.super_TAG.m_stream,name);
  HTML::TD::~TD((TD *)&td_1.super_TAG.m_stream);
  HTML::TD::TD((TD *)local_568,(ostream *)(s + 0x10));
  __s = "no";
  if (value) {
    __s = "yes";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,__s,(allocator<char> *)((long)&td_2.super_TAG.m_stream + 7));
  HTML::TAG::text((TAG *)local_568,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)((long)&td_2.super_TAG.m_stream + 7));
  HTML::TD::~TD((TD *)local_568);
  HTML::TD::TD((TD *)&center.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&center.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)local_900,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_900);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&a.super_TAG.m_stream);
    poVar2 = std::operator<<(local_a78,(string *)tr.super_TAG.m_stream);
    poVar2 = std::operator<<(poVar2,"&");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2,"=");
    std::ostream::operator<<(poVar2,(bool)(~value & 1));
    HTML::A::A((A *)local_c40,(ostream *)(s + 0x10));
    std::__cxx11::stringstream::str();
    this_00 = &HTML::A::href((A *)local_c40,&local_c60)->super_TAG;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c80,"toggle",&local_c81);
    HTML::TAG::text(this_00,&local_c80);
    std::__cxx11::string::~string((string *)&local_c80);
    std::allocator<char>::~allocator(&local_c81);
    std::__cxx11::string::~string((string *)&local_c60);
    HTML::A::~A((A *)local_c40);
    std::__cxx11::stringstream::~stringstream((stringstream *)&a.super_TAG.m_stream);
  }
  HTML::CENTER::~CENTER((CENTER *)local_900);
  HTML::TD::~TD((TD *)&center.super_TAG.m_stream);
  HTML::TR::~TR((TR *)local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, bool value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value ? "yes" : "no"); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        if( url.size() )
        {
          std::stringstream href;
          href << url << "&" << name << "=" << !value;
          A a(s); a.href(href.str()).text("toggle");
        }
      }
    }
}